

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad_gl.c
# Opt level: O0

void glad_gl_load_GL_VERSION_2_1(GLADuserptrloadfunc load,void *userptr)

{
  undefined8 in_RSI;
  code *in_RDI;
  
  if (GLAD_GL_VERSION_2_1 != 0) {
    glad_glUniformMatrix2x3fv =
         (PFNGLUNIFORMMATRIX2X3FVPROC)(*in_RDI)("glUniformMatrix2x3fv",in_RSI);
    glad_glUniformMatrix2x4fv =
         (PFNGLUNIFORMMATRIX2X4FVPROC)(*in_RDI)("glUniformMatrix2x4fv",in_RSI);
    glad_glUniformMatrix3x2fv =
         (PFNGLUNIFORMMATRIX3X2FVPROC)(*in_RDI)("glUniformMatrix3x2fv",in_RSI);
    glad_glUniformMatrix3x4fv =
         (PFNGLUNIFORMMATRIX3X4FVPROC)(*in_RDI)("glUniformMatrix3x4fv",in_RSI);
    glad_glUniformMatrix4x2fv =
         (PFNGLUNIFORMMATRIX4X2FVPROC)(*in_RDI)("glUniformMatrix4x2fv",in_RSI);
    glad_glUniformMatrix4x3fv =
         (PFNGLUNIFORMMATRIX4X3FVPROC)(*in_RDI)("glUniformMatrix4x3fv",in_RSI);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_VERSION_2_1( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_VERSION_2_1) return;
    glUniformMatrix2x3fv = (PFNGLUNIFORMMATRIX2X3FVPROC) load("glUniformMatrix2x3fv", userptr);
    glUniformMatrix2x4fv = (PFNGLUNIFORMMATRIX2X4FVPROC) load("glUniformMatrix2x4fv", userptr);
    glUniformMatrix3x2fv = (PFNGLUNIFORMMATRIX3X2FVPROC) load("glUniformMatrix3x2fv", userptr);
    glUniformMatrix3x4fv = (PFNGLUNIFORMMATRIX3X4FVPROC) load("glUniformMatrix3x4fv", userptr);
    glUniformMatrix4x2fv = (PFNGLUNIFORMMATRIX4X2FVPROC) load("glUniformMatrix4x2fv", userptr);
    glUniformMatrix4x3fv = (PFNGLUNIFORMMATRIX4X3FVPROC) load("glUniformMatrix4x3fv", userptr);
}